

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenSelectSetIfFalse(BinaryenExpressionRef expr,BinaryenExpressionRef ifFalseExpr)

{
  if (expr->_id != SelectId) {
    __assert_fail("expression->is<Select>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xb54,
                  "void BinaryenSelectSetIfFalse(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (ifFalseExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)ifFalseExpr;
    return;
  }
  __assert_fail("ifFalseExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xb55,"void BinaryenSelectSetIfFalse(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenSelectSetIfFalse(BinaryenExpressionRef expr,
                              BinaryenExpressionRef ifFalseExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Select>());
  assert(ifFalseExpr);
  static_cast<Select*>(expression)->ifFalse = (Expression*)ifFalseExpr;
}